

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O0

void __thiscall
CEException::invalid_value::invalid_value(invalid_value *this,string *origin,string *message)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string *origin_00;
  CEExceptionHandler *in_stack_ffffffffffffffb0;
  undefined1 local_39 [57];
  
  origin_00 = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"Invalid Value",(allocator *)origin_00);
  CEExceptionHandler::CEExceptionHandler(in_stack_ffffffffffffffb0,origin_00,in_RDX,in_RSI);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  *in_RDI = &PTR__invalid_value_00150880;
  return;
}

Assistant:

CEException::invalid_value::invalid_value(const std::string& origin,
                                          const std::string& message) :
    CEExceptionHandler(origin, message, "Invalid Value")
{}